

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

uint If_CluSemiCanonicize(word *pTruth,int nVars,int *pCanonPerm)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  word wVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  word *pIn;
  bool bVar8;
  word *pOut;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int pStore [32];
  word pFunc [1024];
  int local_20b8 [32];
  word local_2038 [1025];
  
  If_CluCountOnesInCofs(pTruth,nVars,local_20b8);
  bVar8 = false;
  uVar11 = 0;
  if (0 < nVars) {
    uVar10 = 0;
    uVar11 = 0;
    do {
      iVar1 = local_20b8[uVar10 * 2];
      iVar2 = *(int *)((long)local_2038 + uVar10 * 8 + -0x7c);
      if (iVar2 < iVar1) {
        uVar11 = uVar11 | 1 << ((uint)uVar10 & 0x1f);
        local_20b8[uVar10 * 2] = iVar2;
        *(int *)((long)local_2038 + uVar10 * 8 + -0x7c) = iVar1;
        If_CluChangePhase(pTruth,nVars,(uint)uVar10);
      }
      auVar6 = _DAT_008403e0;
      uVar10 = uVar10 + 1;
    } while ((uint)nVars != uVar10);
    if (0 < nVars) {
      lVar9 = (ulong)(uint)nVars - 1;
      auVar12._8_4_ = (int)lVar9;
      auVar12._0_8_ = lVar9;
      auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_008403e0;
      auVar13 = _DAT_008403d0;
      do {
        auVar14 = auVar13 ^ auVar6;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          pCanonPerm[uVar10] = (int)uVar10;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          pCanonPerm[uVar10 + 1] = (int)uVar10 + 1;
        }
        uVar10 = uVar10 + 2;
        lVar9 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar9 + 2;
      } while ((nVars + 1U & 0xfffffffe) != uVar10);
    }
  }
  pOut = local_2038;
  do {
    if (nVars < 2) break;
    uVar10 = 0;
    bVar4 = false;
    pIn = pTruth;
    do {
      iVar1 = local_20b8[uVar10 * 2];
      wVar5 = local_2038[uVar10 - 0xf];
      pTruth = pIn;
      if ((int)wVar5 < iVar1) {
        bVar8 = (bool)(bVar8 ^ 1);
        *(ulong *)(pCanonPerm + uVar10) =
             CONCAT44((int)*(undefined8 *)(pCanonPerm + uVar10),
                      (int)((ulong)*(undefined8 *)(pCanonPerm + uVar10) >> 0x20));
        local_20b8[uVar10 * 2] = (int)wVar5;
        *(int *)(local_2038 + (uVar10 - 0xf)) = iVar1;
        uVar3 = *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x7c);
        *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x7c) =
             *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x74);
        *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x74) = uVar3;
        If_CluSwapAdjacent(pOut,pIn,(int)uVar10,nVars);
        bVar4 = true;
        pTruth = pOut;
        pOut = pIn;
      }
      uVar10 = uVar10 + 1;
      pIn = pTruth;
    } while (nVars - 1 != uVar10);
  } while (bVar4);
  if (bVar8) {
    uVar7 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar7 = 1;
    }
    if (0 < (int)uVar7) {
      memcpy(pOut,pTruth,(ulong)uVar7 << 3);
    }
  }
  return uVar11;
}

Assistant:

unsigned If_CluSemiCanonicize( word * pTruth, int nVars, int * pCanonPerm )
{
    word pFunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int pStore[CLU_VAR_MAX*2];
    unsigned uCanonPhase = 0;
    int i, Temp, fChange, Counter = 0;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );

    // collect signatures 
    If_CluCountOnesInCofs( pTruth, nVars, pStore );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        If_CluChangePhase( pIn, nVars, i );
    }
    // compute permutation
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    // swap if it was moved an odd number of times
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    return uCanonPhase;
}